

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalParse
          (CodeGeneratorRequest *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string *s_00;
  Version *msg;
  FileDescriptorProto *msg_00;
  uint uVar2;
  char cVar3;
  uint32 tag;
  char *local_48;
  uint local_3c;
  InternalMetadataWithArena *local_38;
  
  local_38 = &this->_internal_metadata_;
  local_48 = ptr;
LAB_002a54b2:
  bVar1 = internal::ParseContext::Done(ctx,&local_48);
  if (bVar1) {
    return local_48;
  }
  local_48 = internal::ReadTag(local_48,&local_3c,0);
  if (local_48 == (char *)0x0) {
    return (char *)0x0;
  }
  uVar2 = local_3c >> 3;
  cVar3 = (char)local_3c;
  if (uVar2 == 0xf) {
    if (cVar3 == 'z') {
      local_48 = local_48 + -1;
      do {
        local_48 = local_48 + 1;
        msg_00 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Add(&this->proto_file_);
        local_48 = internal::ParseContext::ParseMessage<google::protobuf::FileDescriptorProto>
                             (ctx,msg_00,local_48);
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
      } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 'z'));
      goto LAB_002a54b2;
    }
  }
  else {
    if (uVar2 == 2) {
      if (cVar3 != '\x12') goto LAB_002a55d4;
      s_00 = _internal_mutable_parameter_abi_cxx11_(this);
      local_48 = internal::InlineGreedyStringParser(s_00,local_48,ctx);
      goto LAB_002a55f2;
    }
    if (uVar2 == 3) {
      if (cVar3 == '\x1a') {
        msg = _internal_mutable_compiler_version(this);
        local_48 = internal::ParseContext::ParseMessage<google::protobuf::compiler::Version>
                             (ctx,msg,local_48);
        goto LAB_002a55f2;
      }
      goto LAB_002a55d4;
    }
    if ((uVar2 == 1) && (cVar3 == '\n')) {
      local_48 = local_48 + -1;
      do {
        local_48 = local_48 + 1;
        s = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Add(&this->file_to_generate_);
        local_48 = internal::InlineGreedyStringParser(s,local_48,ctx);
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
      } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == '\n'));
      goto LAB_002a54b2;
    }
  }
LAB_002a55d4:
  if ((local_3c == 0) || ((local_3c & 7) == 4)) {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
    return local_48;
  }
  local_48 = internal::UnknownFieldParse(local_3c,local_38,local_48,ctx);
LAB_002a55f2:
  if (local_48 == (char *)0x0) {
    return (char *)0x0;
  }
  goto LAB_002a54b2;
}

Assistant:

const char* CodeGeneratorRequest::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string file_to_generate = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_file_to_generate(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string parameter = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_parameter(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorRequest.parameter");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_compiler_version(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_proto_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}